

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
toml::Value::
ValueConverter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::to(ValueConverter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     *this,Value *v)

{
  bool bVar1;
  value_type *in_RDI;
  Value *element;
  const_iterator __end2;
  const_iterator __begin2;
  Array *__range2;
  Array *array;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  vector<toml::Value,_std::allocator<toml::Value>_> *in_stack_ffffffffffffff88;
  return_type in_stack_ffffffffffffff90;
  value_type *this_00;
  __normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
  local_38;
  return_type local_30;
  undefined1 local_21;
  return_type local_20;
  
  this_00 = in_RDI;
  local_20 = as<std::vector<toml::Value,std::allocator<toml::Value>>>
                       ((Value *)in_stack_ffffffffffffff90);
  bVar1 = std::vector<toml::Value,_std::allocator<toml::Value>_>::empty
                    ((vector<toml::Value,_std::allocator<toml::Value>_> *)this_00);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x23abfa);
  }
  else {
    std::vector<toml::Value,_std::allocator<toml::Value>_>::front
              ((vector<toml::Value,_std::allocator<toml::Value>_> *)in_stack_ffffffffffffff90);
    assureType<std::__cxx11::string>((Value *)this_00);
    local_21 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x23ac20);
    local_30 = local_20;
    local_38._M_current =
         (Value *)std::vector<toml::Value,_std::allocator<toml::Value>_>::begin
                            (in_stack_ffffffffffffff88);
    std::vector<toml::Value,_std::allocator<toml::Value>_>::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
                               *)in_stack_ffffffffffffff90,
                              (__normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
      ::operator*(&local_38);
      in_stack_ffffffffffffff90 = as<std::__cxx11::string>((Value *)in_stack_ffffffffffffff90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,in_RDI);
      __gnu_cxx::
      __normal_iterator<const_toml::Value_*,_std::vector<toml::Value,_std::allocator<toml::Value>_>_>
      ::operator++(&local_38);
    }
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
}

Assistant:

std::vector<T> to(const Value& v)
    {
        const Array& array = v.as<Array>();
        if (array.empty())
            return std::vector<T>();
        array.front().assureType<T>();

        std::vector<T> result;
        for (const auto& element : array) {
            result.push_back(element.as<T>());
        }

        return result;
    }